

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnetworkreplyhttpimpl_p.cpp
# Opt level: O2

void QNetworkReplyHttpImpl::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  QNetworkReplyHttpImplPrivate *this;
  Data *pDVar2;
  DataPointer d;
  bool bVar3;
  undefined8 *puVar4;
  InterfaceType *pIVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == RegisterMethodArgumentMetaType) {
    switch(_id) {
    case 0xc:
    case 0x11:
      puVar4 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar5 = &QtPrivate::QMetaTypeInterfaceWrapper<QNetworkReply::NetworkError>::metaType;
LAB_00202b40:
        *puVar4 = pIVar5;
        goto switchD_002029b9_default;
      }
      break;
    default:
      puVar4 = (undefined8 *)*_a;
      break;
    case 0x10:
      puVar4 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar5 = &QtPrivate::QMetaTypeInterfaceWrapper<QHttpNetworkRequest>::metaType;
        goto LAB_00202b40;
      }
      break;
    case 0x13:
      puVar4 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar5 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QSslError>_>::metaType;
        goto LAB_00202b40;
      }
      break;
    case 0x14:
      puVar4 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar5 = &QtPrivate::QMetaTypeInterfaceWrapper<QSslConfiguration>::metaType;
        goto LAB_00202b40;
      }
      break;
    case 0x15:
      puVar4 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar5 = &QtPrivate::QMetaTypeInterfaceWrapper<QSslPreSharedKeyAuthenticator_*>::metaType;
        goto LAB_00202b40;
      }
      break;
    case 0x16:
      puVar4 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar5 = &QtPrivate::QMetaTypeInterfaceWrapper<QNetworkProxy>::metaType;
        goto LAB_00202b40;
      }
    }
    *puVar4 = 0;
    goto switchD_002029b9_default;
  }
  if (_c == IndexOfMethod) {
    bVar3 = QtMocHelpers::indexOfMethod<void(QNetworkReplyHttpImpl::*)()>
                      ((QtMocHelpers *)_a,(void **)startHttpRequest,0,0);
    if ((((!bVar3) &&
         (bVar3 = QtMocHelpers::indexOfMethod<void(QNetworkReplyHttpImpl::*)()>
                            ((QtMocHelpers *)_a,(void **)abortHttpRequest,0,1), !bVar3)) &&
        (bVar3 = QtMocHelpers::indexOfMethod<void(QNetworkReplyHttpImpl::*)(long_long)>
                           ((QtMocHelpers *)_a,(void **)readBufferSizeChanged,0,2), !bVar3)) &&
       ((bVar3 = QtMocHelpers::indexOfMethod<void(QNetworkReplyHttpImpl::*)(long_long)>
                           ((QtMocHelpers *)_a,(void **)readBufferFreed,0,3), !bVar3 &&
        (bVar3 = QtMocHelpers::indexOfMethod<void(QNetworkReplyHttpImpl::*)()>
                           ((QtMocHelpers *)_a,(void **)startHttpRequestSynchronously,0,4), !bVar3))
       )) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        QtMocHelpers::
        indexOfMethod<void(QNetworkReplyHttpImpl::*)(long_long,QByteArray_const&,bool,long_long)>
                  ((QtMocHelpers *)_a,(void **)haveUploadData,0,5);
        return;
      }
      goto LAB_00202fee;
    }
    goto switchD_002029b9_default;
  }
  if (_c != InvokeMetaMethod) goto switchD_002029b9_default;
  switch(_id) {
  case 0:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      startHttpRequest((QNetworkReplyHttpImpl *)_o);
      return;
    }
    break;
  case 1:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      abortHttpRequest((QNetworkReplyHttpImpl *)_o);
      return;
    }
    break;
  case 2:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      readBufferSizeChanged((QNetworkReplyHttpImpl *)_o,*_a[1]);
      return;
    }
    break;
  case 3:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      readBufferFreed((QNetworkReplyHttpImpl *)_o,*_a[1]);
      return;
    }
    break;
  case 4:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      startHttpRequestSynchronously((QNetworkReplyHttpImpl *)_o);
      return;
    }
    break;
  case 5:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      haveUploadData((QNetworkReplyHttpImpl *)_o,*_a[1],(QByteArray *)_a[2],*_a[3],*_a[4]);
      return;
    }
    break;
  case 6:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      QNetworkReplyHttpImplPrivate::_q_startOperation(*(QNetworkReplyHttpImplPrivate **)(_o + 8));
      return;
    }
    break;
  case 7:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      QNetworkReplyHttpImplPrivate::_q_cacheLoadReadyRead
                (*(QNetworkReplyHttpImplPrivate **)(_o + 8));
      return;
    }
    break;
  case 8:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      QNetworkReplyHttpImplPrivate::_q_bufferOutgoingData
                (*(QNetworkReplyHttpImplPrivate **)(_o + 8));
      return;
    }
    break;
  case 9:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      QNetworkReplyHttpImplPrivate::_q_bufferOutgoingDataFinished
                (*(QNetworkReplyHttpImplPrivate **)(_o + 8));
      return;
    }
    break;
  case 10:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      (**(code **)(**(long **)(*(long *)(_o + 8) + 8) + 0xf0))();
      return;
    }
    break;
  case 0xb:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      QNetworkReplyHttpImplPrivate::finished(*(QNetworkReplyHttpImplPrivate **)(_o + 8));
      return;
    }
    break;
  case 0xc:
  case 0x11:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      QNetworkReplyHttpImplPrivate::error
                (*(QNetworkReplyHttpImplPrivate **)(_o + 8),*_a[1],(QString *)_a[2]);
      return;
    }
    break;
  case 0xd:
    this = *(QNetworkReplyHttpImplPrivate **)(_o + 8);
    pDVar2 = ((DataPointer *)_a[1])->d;
    d = *(DataPointer *)_a[1];
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QNetworkReplyHttpImplPrivate::replyDownloadData(this,(QByteArray)d);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&stack0xffffffffffffffd8)
    ;
  default:
switchD_002029b9_default:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
    break;
  case 0xe:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      QNetworkReplyHttpImplPrivate::replyFinished(*(QNetworkReplyHttpImplPrivate **)(_o + 8));
      return;
    }
    break;
  case 0xf:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      QNetworkReplyHttpImplPrivate::replyDownloadProgressSlot
                (*(QNetworkReplyHttpImplPrivate **)(_o + 8),*_a[1],*_a[2]);
      return;
    }
    break;
  case 0x10:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      QNetworkReplyHttpImplPrivate::httpAuthenticationRequired
                (*(QNetworkReplyHttpImplPrivate **)(_o + 8),(QHttpNetworkRequest *)_a[1],*_a[2]);
      return;
    }
    break;
  case 0x12:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      QNetworkReplyHttpImplPrivate::replyEncrypted(*(QNetworkReplyHttpImplPrivate **)(_o + 8));
      return;
    }
    break;
  case 0x13:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      QNetworkReplyHttpImplPrivate::replySslErrors
                (*(QNetworkReplyHttpImplPrivate **)(_o + 8),(QList<QSslError> *)_a[1],*_a[2],*_a[3])
      ;
      return;
    }
    break;
  case 0x14:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      QNetworkReplyHttpImplPrivate::replySslConfigurationChanged
                (*(QNetworkReplyHttpImplPrivate **)(_o + 8),(QSslConfiguration *)_a[1]);
      return;
    }
    break;
  case 0x15:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      QNetworkReplyHttpImplPrivate::replyPreSharedKeyAuthenticationRequiredSlot
                (*(QNetworkReplyHttpImplPrivate **)(_o + 8),*_a[1]);
      return;
    }
    break;
  case 0x16:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      QNetworkReplyHttpImplPrivate::proxyAuthenticationRequired
                (*(QNetworkReplyHttpImplPrivate **)(_o + 8),(QNetworkProxy *)_a[1],*_a[2]);
      return;
    }
    break;
  case 0x17:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      QNetworkReplyHttpImplPrivate::resetUploadDataSlot
                (*(QNetworkReplyHttpImplPrivate **)(_o + 8),*_a[1]);
      return;
    }
    break;
  case 0x18:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      QNetworkReplyHttpImplPrivate::wantUploadDataSlot
                (*(QNetworkReplyHttpImplPrivate **)(_o + 8),*_a[1]);
      return;
    }
    break;
  case 0x19:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      QNetworkReplyHttpImplPrivate::sentUploadDataSlot
                (*(QNetworkReplyHttpImplPrivate **)(_o + 8),*_a[1],*_a[2]);
      return;
    }
    break;
  case 0x1a:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      QNetworkReplyHttpImplPrivate::uploadByteDeviceReadyReadSlot
                (*(QNetworkReplyHttpImplPrivate **)(_o + 8));
      return;
    }
    break;
  case 0x1b:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      QNetworkReplyHttpImplPrivate::emitReplyUploadProgress
                (*(QNetworkReplyHttpImplPrivate **)(_o + 8),*_a[1],*_a[2]);
      return;
    }
    break;
  case 0x1c:
    *(undefined8 *)(*(long *)(_o + 8) + 0x2c8) = 0;
    goto switchD_002029b9_default;
  case 0x1d:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      QNetworkReplyHttpImplPrivate::_q_metaDataChanged(*(QNetworkReplyHttpImplPrivate **)(_o + 8));
      return;
    }
    break;
  case 0x1e:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      QNetworkReplyHttpImplPrivate::onRedirected
                (*(QNetworkReplyHttpImplPrivate **)(_o + 8),(QUrl *)_a[1],*_a[2],*_a[3]);
      return;
    }
    break;
  case 0x1f:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      QNetworkReplyHttpImplPrivate::followRedirect(*(QNetworkReplyHttpImplPrivate **)(_o + 8));
      return;
    }
  }
LAB_00202fee:
  __stack_chk_fail();
}

Assistant:

void QNetworkReplyHttpImpl::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QNetworkReplyHttpImpl *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->startHttpRequest(); break;
        case 1: _t->abortHttpRequest(); break;
        case 2: _t->readBufferSizeChanged((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1]))); break;
        case 3: _t->readBufferFreed((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1]))); break;
        case 4: _t->startHttpRequestSynchronously(); break;
        case 5: _t->haveUploadData((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QByteArray>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<bool>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[4]))); break;
        case 6: _t->d_func()->_q_startOperation(); break;
        case 7: _t->d_func()->_q_cacheLoadReadyRead(); break;
        case 8: _t->d_func()->_q_bufferOutgoingData(); break;
        case 9: _t->d_func()->_q_bufferOutgoingDataFinished(); break;
        case 10: _t->d_func()->_q_transferTimedOut(); break;
        case 11: _t->d_func()->_q_finished(); break;
        case 12: _t->d_func()->_q_error((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 13: _t->d_func()->replyDownloadData((*reinterpret_cast< std::add_pointer_t<QByteArray>>(_a[1]))); break;
        case 14: _t->d_func()->replyFinished(); break;
        case 15: _t->d_func()->replyDownloadProgressSlot((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 16: _t->d_func()->httpAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QHttpNetworkRequest>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 17: _t->d_func()->httpError((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 18: _t->d_func()->replyEncrypted(); break;
        case 19: _t->d_func()->replySslErrors((*reinterpret_cast< std::add_pointer_t<QList<QSslError>>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<bool*>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QList<QSslError>*>>(_a[3]))); break;
        case 20: _t->d_func()->replySslConfigurationChanged((*reinterpret_cast< std::add_pointer_t<QSslConfiguration>>(_a[1]))); break;
        case 21: _t->d_func()->replyPreSharedKeyAuthenticationRequiredSlot((*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[1]))); break;
        case 22: _t->d_func()->proxyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QNetworkProxy>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 23: _t->d_func()->resetUploadDataSlot((*reinterpret_cast< std::add_pointer_t<bool*>>(_a[1]))); break;
        case 24: _t->d_func()->wantUploadDataSlot((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1]))); break;
        case 25: _t->d_func()->sentUploadDataSlot((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 26: _t->d_func()->uploadByteDeviceReadyReadSlot(); break;
        case 27: _t->d_func()->emitReplyUploadProgress((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 28: _t->d_func()->_q_cacheSaveDeviceAboutToClose(); break;
        case 29: _t->d_func()->_q_metaDataChanged(); break;
        case 30: _t->d_func()->onRedirected((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 31: _t->d_func()->followRedirect(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 12:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 16:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QHttpNetworkRequest >(); break;
            }
            break;
        case 17:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 19:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QSslError> >(); break;
            }
            break;
        case 20:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslConfiguration >(); break;
            }
            break;
        case 21:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslPreSharedKeyAuthenticator* >(); break;
            }
            break;
        case 22:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkProxy >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QNetworkReplyHttpImpl::*)()>(_a, &QNetworkReplyHttpImpl::startHttpRequest, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReplyHttpImpl::*)()>(_a, &QNetworkReplyHttpImpl::abortHttpRequest, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReplyHttpImpl::*)(qint64 )>(_a, &QNetworkReplyHttpImpl::readBufferSizeChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReplyHttpImpl::*)(qint64 )>(_a, &QNetworkReplyHttpImpl::readBufferFreed, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReplyHttpImpl::*)()>(_a, &QNetworkReplyHttpImpl::startHttpRequestSynchronously, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReplyHttpImpl::*)(const qint64 , const QByteArray & , bool , qint64 )>(_a, &QNetworkReplyHttpImpl::haveUploadData, 5))
            return;
    }
}